

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

_Bool prefs_save(char *path,_func_void_ang_file_ptr *dump,char *title)

{
  _Bool _Var1;
  int iVar2;
  ang_file *paVar3;
  ang_file *f;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char new_fname [1024];
  char old_fname [1024];
  char end_line [1024];
  char start_line [1024];
  char buf [1024];
  
  file_get_tempfile(new_fname,0x400,path,"new");
  strnfmt(start_line,0x400,"%s begin %s","#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#",title);
  strnfmt(end_line,0x400,"%s end %s","#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#",title);
  paVar3 = file_open(path,MODE_READ,FTYPE_TEXT);
  if (paVar3 != (ang_file *)0x0) {
    f = file_open(new_fname,MODE_WRITE,FTYPE_TEXT);
    if (f == (ang_file *)0x0) {
      file_close(paVar3);
      msg("Failed to create file %s",new_fname);
    }
    else {
      bVar4 = false;
      bVar6 = false;
      while( true ) {
        bVar5 = bVar6;
        _Var1 = file_getl(paVar3,buf,0x400);
        if (!_Var1) break;
        iVar2 = strcmp(buf,start_line);
        bVar6 = iVar2 == 0;
        if (!bVar6) {
          iVar2 = strcmp(buf,end_line);
          if (iVar2 == 0 || bVar5) {
            bVar4 = (bool)(bVar4 | iVar2 == 0);
            bVar6 = (bool)(iVar2 != 0 & bVar5);
          }
          else {
            file_putf(f,"%s\n",buf);
          }
        }
      }
      file_close(paVar3);
      file_close(f);
      if (bVar4) {
        file_get_tempfile(old_fname,0x400,path,"old");
        _Var1 = file_move(path,old_fname);
        if (_Var1) {
          file_move(new_fname,path);
          file_delete(old_fname);
        }
      }
      else {
        file_delete(new_fname);
      }
    }
  }
  paVar3 = file_open(path,MODE_APPEND,FTYPE_TEXT);
  if (paVar3 != (ang_file *)0x0) {
    file_putf(paVar3,"%s begin %s\n","#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#",title);
    file_putf(paVar3,"# *Warning!*  The lines below are an automatic dump.\n");
    file_putf(paVar3,"# Don\'t edit them; changes will be deleted and replaced automatically.\n");
    file_putf(paVar3,"\n");
    (*dump)(paVar3);
    file_putf(paVar3,"\n");
    file_putf(paVar3,"# *Warning!*  The lines above are an automatic dump.\n");
    file_putf(paVar3,"# Don\'t edit them; changes will be deleted and replaced automatically.\n");
    file_putf(paVar3,"%s end %s\n","#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#=#",title);
    file_close(paVar3);
  }
  return paVar3 != (ang_file *)0x0;
}

Assistant:

bool prefs_save(const char *path, void (*dump)(ang_file *), const char *title)
{
	ang_file *fff;

	/* Remove old keymaps */
	remove_old_dump(path, title);

	fff = file_open(path, MODE_APPEND, FTYPE_TEXT);
	if (!fff) {
		return false;
	}

	/* Append the header */
	pref_header(fff, title);
	file_putf(fff, "\n");

	dump(fff);

	file_putf(fff, "\n");
	pref_footer(fff, title);
	file_close(fff);

	return true;
}